

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ControlledLifetimeResource.h
# Opt level: O2

void __thiscall
Rml::ControlledLifetimeResource<Rml::ElementMetaPool>::Initialize
          (ControlledLifetimeResource<Rml::ElementMetaPool> *this)

{
  code *pcVar1;
  bool bVar2;
  ElementMetaPool *this_00;
  
  if (this->pointer != (ElementMetaPool *)0x0) {
    bVar2 = Assert("Resource already initialized.",
                   "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ControlledLifetimeResource.h"
                   ,0x2e);
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
  }
  this_00 = (ElementMetaPool *)operator_new(0x28);
  (this_00->pool).chunk_size = 0;
  (this_00->pool).grow = false;
  *(undefined3 *)&(this_00->pool).field_0x5 = 0;
  (this_00->pool).pool = (PoolChunk *)0x0;
  (this_00->pool).first_allocated_node = (PoolNode *)0x0;
  (this_00->pool).first_free_node = (PoolNode *)0x0;
  (this_00->pool).num_allocated_objects = 0;
  (this_00->pool).max_num_allocated_objects = 0;
  ElementMetaPool::ElementMetaPool(this_00);
  this->pointer = this_00;
  return;
}

Assistant:

void Initialize()
	{
		RMLUI_ASSERTMSG(!pointer, "Resource already initialized.");
		pointer = new T();
	}